

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_http.cpp
# Opt level: O0

void dlib::http_impl::parse_url(string *word,key_value_map *queries)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  undefined1 *puVar5;
  string *in_RDI;
  string value;
  string key;
  istringstream sin;
  size_type pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  string local_228 [16];
  string *in_stack_fffffffffffffde8;
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [48];
  istream local_198;
  ulong local_18;
  
  local_18 = 0;
  while( true ) {
    uVar1 = local_18;
    uVar3 = std::__cxx11::string::size();
    if (uVar3 <= uVar1) break;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
    if (*pcVar4 == '&') {
      puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
      *puVar5 = 0x20;
    }
    local_18 = local_18 + 1;
  }
  std::__cxx11::istringstream::istringstream((istringstream *)&local_198,in_RDI,_S_in);
  std::operator>>(&local_198,in_RDI);
  while( true ) {
    bVar2 = std::ios::operator_cast_to_bool
                      ((ios *)(local_198._vptr_basic_istream[-3] +
                              (long)&local_198._vptr_basic_istream));
    if (!bVar2) break;
    local_18 = std::__cxx11::string::find_first_of((char *)in_RDI,0x4e4632);
    if (local_18 != 0xffffffffffffffff) {
      std::__cxx11::string::substr((ulong)local_1e8,(ulong)in_RDI);
      urldecode(in_stack_fffffffffffffde8);
      std::__cxx11::string::~string(local_1e8);
      std::__cxx11::string::substr((ulong)local_228,(ulong)in_RDI);
      urldecode(in_stack_fffffffffffffde8);
      std::__cxx11::string::~string(local_228);
      in_stack_fffffffffffffdb0 =
           constmap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((constmap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      std::__cxx11::string::operator=((string *)in_stack_fffffffffffffdb0,local_208);
      std::__cxx11::string::~string(local_208);
      std::__cxx11::string::~string(local_1c8);
    }
    std::operator>>(&local_198,in_RDI);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&local_198);
  return;
}

Assistant:

void parse_url(
            std::string word, 
            key_value_map& queries
        )
        /*!
            Parses the query string of a URL.  word should be the stuff that comes
            after the ? in the query URL.
        !*/
        {
            std::string::size_type pos;

            for (pos = 0; pos < word.size(); ++pos)
            {
                if (word[pos] == '&')
                    word[pos] = ' ';
            }

            std::istringstream sin(word);
            sin >> word;
            while (sin)
            {
                pos = word.find_first_of("=");
                if (pos != std::string::npos)
                {
                    std::string key = urldecode(word.substr(0,pos));
                    std::string value = urldecode(word.substr(pos+1));

                    queries[key] = value;
                }
                sin >> word;
            }
        }